

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * exprINAffinity(Parse *pParse,Expr *pExpr)

{
  Expr *pExpr_00;
  char aff2;
  uint uVar1;
  char *pcVar2;
  Expr *pExpr_01;
  ulong uVar3;
  ulong uVar4;
  Select *pSVar5;
  long lVar6;
  
  pExpr_00 = pExpr->pLeft;
  uVar1 = sqlite3ExprVectorSize(pExpr_00);
  if ((pExpr->flags & 0x800) == 0) {
    pSVar5 = (Select *)0x0;
  }
  else {
    pSVar5 = (pExpr->x).pSelect;
  }
  pcVar2 = (char *)sqlite3DbMallocRaw(pParse->db,(long)(int)(uVar1 + 1));
  if (pcVar2 != (char *)0x0) {
    uVar4 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    lVar6 = 8;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pExpr_01 = sqlite3VectorFieldSubexpr(pExpr_00,(int)uVar4);
      aff2 = sqlite3ExprAffinity(pExpr_01);
      if (pSVar5 != (Select *)0x0) {
        aff2 = sqlite3CompareAffinity(*(Expr **)((long)pSVar5->pEList->a + lVar6 + -8),aff2);
      }
      pcVar2[uVar4] = aff2;
      lVar6 = lVar6 + 0x20;
    }
    pcVar2[(int)uVar1] = '\0';
  }
  return pcVar2;
}

Assistant:

static char *exprINAffinity(Parse *pParse, Expr *pExpr){
  Expr *pLeft = pExpr->pLeft;
  int nVal = sqlite3ExprVectorSize(pLeft);
  Select *pSelect = (pExpr->flags & EP_xIsSelect) ? pExpr->x.pSelect : 0;
  char *zRet;

  assert( pExpr->op==TK_IN );
  zRet = sqlite3DbMallocRaw(pParse->db, nVal+1);
  if( zRet ){
    int i;
    for(i=0; i<nVal; i++){
      Expr *pA = sqlite3VectorFieldSubexpr(pLeft, i);
      char a = sqlite3ExprAffinity(pA);
      if( pSelect ){
        zRet[i] = sqlite3CompareAffinity(pSelect->pEList->a[i].pExpr, a);
      }else{
        zRet[i] = a;
      }
    }
    zRet[nVal] = '\0';
  }
  return zRet;
}